

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_20;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x1990478;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1990540;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf0 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf4 = 1;
  local_20 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__0198fae0,&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x198fe70;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x198ff50;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)
             &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__0198fb08);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x198fbd0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x198fd98;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x198fc98;
  *(undefined ***)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa8 = &PTR__TPZVec_0183b5f0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xb0 = 0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xb8 = 0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xc0 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fNAlloc = 0;
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x198f890;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x198fa58;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x198f958;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}